

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port_instance.c
# Opt level: O1

apx_error_t
apx_portInstance_derive_properties(apx_portInstance_t *self,uint32_t offset,uint32_t *size)

{
  adt_bytearray_t *self_00;
  uint32_t uVar1;
  int iVar2;
  uint8_t *begin;
  uint8_t *next;
  apx_programHeader_t header;
  uint8_t *local_48;
  apx_programHeader_t local_3c;
  
  iVar2 = 1;
  if (size != (uint32_t *)0x0 && self != (apx_portInstance_t *)0x0) {
    self_00 = (&self->pack_program)[self->port_type != '\x01'];
    local_48 = (uint8_t *)0x0;
    if (self_00 == (adt_bytearray_t *)0x0) {
      iVar2 = 0x24;
    }
    else {
      begin = adt_bytearray_data(self_00);
      uVar1 = adt_bytearray_length(self_00);
      iVar2 = apx_program_decode_header(begin,begin + uVar1,&local_48,&local_3c);
      if (iVar2 == 0) {
        self->data_size = local_3c.data_size;
        self->has_dynamic_data = local_3c.has_dynamic_data;
        self->queue_length = local_3c.queue_length;
        self->element_size = local_3c.element_size;
        iVar2 = 0;
      }
    }
    if (iVar2 == 0) {
      self->data_offset = offset;
      *size = self->data_size;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

apx_error_t apx_portInstance_derive_properties(apx_portInstance_t* self, uint32_t offset, uint32_t* size)
{
   if ( (self != NULL) && (size != NULL) )
   {
      apx_error_t result = APX_NO_ERROR;
      result = process_info_from_program_header(self, (self->port_type == APX_PROVIDE_PORT) ? self->pack_program : self->unpack_program);
      if (result != APX_NO_ERROR)
      {
         return result;
      }
      self->data_offset = offset;
      *size = self->data_size;
      return APX_NO_ERROR;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}